

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

void __thiscall
kj::Maybe<kj::AuthenticatedStream>::Maybe
          (Maybe<kj::AuthenticatedStream> *this,Maybe<kj::AuthenticatedStream> *other)

{
  NullableValue<kj::AuthenticatedStream> *other_00;
  Maybe<kj::AuthenticatedStream> *other_local;
  Maybe<kj::AuthenticatedStream> *this_local;
  
  other_00 = mv<kj::_::NullableValue<kj::AuthenticatedStream>>(&other->ptr);
  kj::_::NullableValue<kj::AuthenticatedStream>::NullableValue(&this->ptr,other_00);
  operator=(other);
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }